

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O3

void Ssw_SmlAssignDist1(Ssw_Sml_t *p,uint *pPat)

{
  uint *puVar1;
  uint uVar2;
  Aig_Man_t *pAVar3;
  uint uVar4;
  int iVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  
  iVar5 = p->nFrames;
  if (iVar5 < 1) {
    __assert_fail("p->nFrames > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                  ,0x273,"void Ssw_SmlAssignDist1(Ssw_Sml_t *, unsigned int *)");
  }
  pAVar3 = p->pAig;
  if (iVar5 == 1) {
    pVVar6 = pAVar3->vCis;
    if (0 < pVVar6->nSize) {
      uVar10 = 0;
      do {
        Ssw_SmlObjAssignConst
                  (p,(Aig_Obj_t *)pVVar6->pArray[uVar10],
                   (uint)((pPat[uVar10 >> 5 & 0x7ffffff] >> ((uint)uVar10 & 0x1f) & 1) != 0),0);
        uVar10 = uVar10 + 1;
        pAVar3 = p->pAig;
        pVVar6 = pAVar3->vCis;
      } while ((long)uVar10 < (long)pVVar6->nSize);
    }
    uVar4 = p->nWordsTotal * 0x20 - 1;
    if (pAVar3->nObjs[2] < (int)uVar4) {
      uVar4 = pAVar3->nObjs[2];
    }
    if (0 < (int)uVar4) {
      uVar10 = 1;
      do {
        if ((long)pVVar6->nSize <= (long)(uVar10 - 1)) {
LAB_006b223d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        puVar1 = (uint *)((long)&p[1].pAig +
                         (uVar10 >> 5 & 0x7ffffff) * 4 +
                         (long)p->nWordsTotal *
                         (long)*(int *)((long)pVVar6->pArray[uVar10 - 1] + 0x24) * 4);
        *puVar1 = *puVar1 ^ 1 << ((byte)uVar10 & 0x1f);
        bVar12 = uVar10 != uVar4;
        uVar10 = uVar10 + 1;
      } while (bVar12);
    }
  }
  else {
    iVar8 = pAVar3->nObjs[2] - pAVar3->nRegs;
    iVar9 = 0;
    lVar11 = 0;
    do {
      if (0 < pAVar3->nTruePis) {
        lVar7 = 0;
        do {
          if (pAVar3->vCis->nSize <= lVar7) goto LAB_006b223d;
          uVar4 = iVar9 + (int)lVar7;
          Ssw_SmlObjAssignConst
                    (p,(Aig_Obj_t *)pAVar3->vCis->pArray[lVar7],
                     (uint)((pPat[(int)uVar4 >> 5] >> (uVar4 & 0x1f) & 1) != 0),(int)lVar11);
          lVar7 = lVar7 + 1;
          pAVar3 = p->pAig;
        } while (lVar7 < pAVar3->nTruePis);
        iVar5 = p->nFrames;
      }
      lVar11 = lVar11 + 1;
      iVar9 = iVar9 + iVar8;
    } while (lVar11 < iVar5);
    if (0 < pAVar3->nRegs) {
      iVar5 = 0;
      do {
        uVar4 = pAVar3->nTruePis + iVar5;
        if (((int)uVar4 < 0) || (pAVar3->vCis->nSize <= (int)uVar4)) goto LAB_006b223d;
        iVar9 = iVar5 + 1;
        uVar2 = p->nFrames * iVar8 + iVar5;
        Ssw_SmlObjAssignConst
                  (p,(Aig_Obj_t *)pAVar3->vCis->pArray[uVar4],
                   (uint)((pPat[(int)uVar2 >> 5] >> (uVar2 & 0x1f) & 1) != 0),0);
        pAVar3 = p->pAig;
        iVar5 = iVar9;
      } while (iVar9 < pAVar3->nRegs);
    }
  }
  return;
}

Assistant:

void Ssw_SmlAssignDist1( Ssw_Sml_t * p, unsigned * pPat )
{
    Aig_Obj_t * pObj;
    int f, i, k, Limit, nTruePis;
    assert( p->nFrames > 0 );
    if ( p->nFrames == 1 )
    {
        // copy the PI info
        Aig_ManForEachCi( p->pAig, pObj, i )
            Ssw_SmlObjAssignConst( p, pObj, Abc_InfoHasBit(pPat, i), 0 );
        // flip one bit
        Limit = Abc_MinInt( Aig_ManCiNum(p->pAig), p->nWordsTotal * 32 - 1 );
        for ( i = 0; i < Limit; i++ )
            Abc_InfoXorBit( Ssw_ObjSim( p, Aig_ManCi(p->pAig,i)->Id ), i+1 );
    }
    else
    {
        int fUseDist1 = 0;

        // copy the PI info for each frame
        nTruePis = Aig_ManCiNum(p->pAig) - Aig_ManRegNum(p->pAig);
        for ( f = 0; f < p->nFrames; f++ )
            Saig_ManForEachPi( p->pAig, pObj, i )
                Ssw_SmlObjAssignConst( p, pObj, Abc_InfoHasBit(pPat, nTruePis * f + i), f );
        // copy the latch info
        k = 0;
        Saig_ManForEachLo( p->pAig, pObj, i )
            Ssw_SmlObjAssignConst( p, pObj, Abc_InfoHasBit(pPat, nTruePis * p->nFrames + k++), 0 );
//        assert( p->pFrames == NULL || nTruePis * p->nFrames + k == Aig_ManCiNum(p->pFrames) );

        // flip one bit of the last frame
        if ( fUseDist1 ) //&& p->nFrames == 2 )
        {
            Limit = Abc_MinInt( nTruePis, p->nWordsFrame * 32 - 1 );
            for ( i = 0; i < Limit; i++ )
                Abc_InfoXorBit( Ssw_ObjSim( p, Aig_ManCi(p->pAig, i)->Id ) + p->nWordsFrame*(p->nFrames-1), i+1 );
        }
    }
}